

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Vector.h
# Opt level: O0

Vector<double,_3,_true> *
Nova::Vector<double,_3,_true>::Axis_Vector(Vector<double,_3,_true> *__return_storage_ptr__,int axis)

{
  double *pdVar1;
  bool local_15;
  int axis_local;
  Vector<double,_3,_true> *vec;
  
  local_15 = 2 < (uint)axis;
  if (local_15) {
    __assert_fail("axis>=0 && axis<d",
                  "/workspace/llm4binary/github/license_c_cmakelists/OrionQuest[P]Nova/Library/Tools/include/nova/Tools/Vectors/Vector.h"
                  ,0x1df,
                  "static Vector<T, d, order_ascending> Nova::Vector<double, 3>::Axis_Vector(const int) [T = double, d = 3, order_ascending = true]"
                 );
  }
  Vector(__return_storage_ptr__);
  pdVar1 = operator()(__return_storage_ptr__,axis);
  *pdVar1 = 1.0;
  return __return_storage_ptr__;
}

Assistant:

static Vector Axis_Vector(const int axis)
    {
        assert(axis>=0 && axis<d);
        Vector vec;vec(axis)=1;
        return vec;
    }